

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

double __thiscall
duckdb::Interpolator<false>::Extract<double,double>
          (Interpolator<false> *this,double *dest,Vector *result)

{
  double dVar1;
  bool bVar2;
  InvalidInputException *pIVar3;
  duckdb *pdVar4;
  double dVar5;
  double result_1;
  double local_48;
  string local_40;
  double local_20;
  
  dVar5 = *dest;
  if (this->CRN == this->FRN) {
    pdVar4 = (duckdb *)0x0;
    bVar2 = TryCast::Operation<double,double>(dVar5,&local_48,false);
    if (!bVar2) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_40,pdVar4,dVar5);
      InvalidInputException::InvalidInputException(pIVar3,(string *)&local_40);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    pdVar4 = (duckdb *)0x0;
    bVar2 = TryCast::Operation<double,double>(dVar5,&local_48,false);
    dVar1 = local_48;
    if (!bVar2) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_40,pdVar4,dVar5);
      InvalidInputException::InvalidInputException(pIVar3,(string *)&local_40);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_20 = dest[1];
    pdVar4 = (duckdb *)0x0;
    bVar2 = TryCast::Operation<double,double>(local_20,&local_48,false);
    if (!bVar2) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_40,pdVar4,local_20);
      InvalidInputException::InvalidInputException(pIVar3,(string *)&local_40);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    dVar5 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_48 = dVar5 * local_48 + dVar1 * (1.0 - dVar5);
  }
  return local_48;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}